

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintObservationSets_abi_cxx11_
          (MADPComponentDiscreteObservations *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ulong uVar4;
  size_type sVar5;
  size_t sVar6;
  void *this_00;
  reference pOVar7;
  long in_RSI;
  string *in_RDI;
  const_iterator l;
  const_iterator f;
  Index agentIndex;
  stringstream ss_1;
  stringstream ss;
  stringstream *in_stack_fffffffffffffc18;
  E *in_stack_fffffffffffffc20;
  string local_360 [32];
  ObservationDiscrete *local_340;
  __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
  local_338;
  uint local_330;
  stringstream local_320 [16];
  ostream local_310 [376];
  stringstream local_198 [16];
  ostream local_188 [276];
  Index in_stack_ffffffffffffff8c;
  MADPComponentDiscreteObservations *in_stack_ffffffffffffff90;
  
  std::__cxx11::stringstream::stringstream(local_198);
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_320);
    poVar2 = std::operator<<(local_310,"MADPComponentDiscreteObservations::PrintObservationSets(");
    poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  poVar2 = std::operator<<(local_188,"Observations:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_330 = 0;
  while( true ) {
    uVar4 = (ulong)local_330;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x40));
    if (sVar5 <= uVar4) break;
    poVar2 = std::operator<<(local_188,"agentI ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_330);
    poVar2 = std::operator<<(poVar2," - nrObservations ");
    sVar6 = GetNrObservations(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    this_00 = (void *)std::ostream::operator<<(poVar2,sVar6);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RSI + 0x58),(ulong)local_330);
    local_338._M_current =
         (ObservationDiscrete *)
         std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::begin
                   ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                    in_stack_fffffffffffffc18);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RSI + 0x58),(ulong)local_330);
    local_340 = (ObservationDiscrete *)
                std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::end
                          ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                           in_stack_fffffffffffffc18);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                          *)in_stack_fffffffffffffc20,
                         (__normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                          *)in_stack_fffffffffffffc18);
      if (!bVar1) break;
      poVar2 = local_188;
      pOVar7 = __gnu_cxx::
               __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
               ::operator*(&local_338);
      (*(pOVar7->super_Observation).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])
                (local_360);
      in_stack_fffffffffffffc20 = (E *)std::operator<<(poVar2,local_360);
      std::ostream::operator<<(in_stack_fffffffffffffc20,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_360);
      __gnu_cxx::
      __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
      ::operator++((__normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                    *)poVar2,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
    }
    local_330 = local_330 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintObservationSets() const
{    
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintObservationSets("<< 
        ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    ss << "Observations:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrObservations.size(); agentIndex++)
    {
    ss << "agentI " << agentIndex << " - nrObservations " << 
        GetNrObservations(agentIndex)<<endl;
    vector<ObservationDiscrete>::const_iterator f =
        _m_observationVecs[agentIndex].begin();
    vector<ObservationDiscrete>::const_iterator l =
        _m_observationVecs[agentIndex].end();
    while(f != l)
    {
        ss << (*f).SoftPrint() << endl;
//        GetName() << " - " << (*f).GetDescription()<<endl;
        f++;
    }
    }
    return(ss.str());
}